

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O3

unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_> *node)

{
  long *in_RDX;
  anon_class_8_1_a78179b7_conflict1 local_40;
  _Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  local_38;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  local_28;
  
  local_38.
  super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
  .
  super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
  ._M_index = *(byte *)(*in_RDX + 0x10);
  local_40.__lhs = &local_38;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_&&>
    ::_S_vtable._M_arr
    [local_38.
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     ._M_index]._M_data)
            (&local_40,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
              *)(*in_RDX + 8));
  local_40.__lhs =
       (_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
        *)node;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/include/verilogAST/transformer.hpp:13:9)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_&>
    ::_S_vtable._M_arr
    [local_38.
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     ._M_index]._M_data)
            (&local_28,(anon_class_8_1_8991fb9c_conflict4 *)&local_40,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
              *)&local_38);
  local_40.__lhs =
       (_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
        *)(*in_RDX + 8);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_&>
    ::_S_vtable._M_arr
    [local_28.
     super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
     .
     super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     ._M_index]._M_data)((anon_class_8_1_8991fb9c *)&local_40,&local_28);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_&>
    ::_S_vtable._M_arr
    [local_28.
     super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
     .
     super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_40,&local_28);
  local_28.
  super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  .
  super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
  .
  super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
  .
  super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
  .
  super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
  .
  super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
  ._M_index = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_&>
    ::_S_vtable._M_arr
    [local_38.
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
     ._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_40,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
              *)&local_38);
  this->_vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>,_true,_true>
          )(__uniq_ptr_data<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Attribute> Transformer::visit(std::unique_ptr<Attribute> node) {
  node->value = this->visit(std::move(node->value));
  return node;
}